

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadPoseVertices(OgreBinarySerializer *this,Pose *pose)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined1 local_38 [8];
  Vertex v;
  uint16_t id;
  Pose *pose_local;
  OgreBinarySerializer *this_local;
  
  unique0x100001e3 = pose;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    v.normal.y._2_2_ = ReadHeader(this,true);
    while (bVar1 = AtEnd(this), !bVar1 && v.normal.y._2_2_ == 0xc111) {
      Pose::Vertex::Vertex((Vertex *)local_38);
      local_38._0_4_ = Read<unsigned_int>(this);
      ReadVector(this,(aiVector3D *)(local_38 + 4));
      if ((stack0xffffffffffffffe8->hasNormals & 1U) != 0) {
        ReadVector(this,(aiVector3D *)&v.offset.y);
      }
      pmVar2 = std::
               map<unsigned_int,_Assimp::Ogre::Pose::Vertex,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::Ogre::Pose::Vertex>_>_>
               ::operator[](&stack0xffffffffffffffe8->vertices,(key_type *)local_38);
      pmVar2->index = local_38._0_4_;
      (pmVar2->offset).x = (float)local_38._4_4_;
      (pmVar2->offset).y = (float)v.index;
      (pmVar2->offset).z = v.offset.x;
      (pmVar2->normal).x = v.offset.y;
      (pmVar2->normal).y = v.offset.z;
      (pmVar2->normal).z = v.normal.x;
      bVar1 = AtEnd(this);
      if (!bVar1) {
        v.normal.y._2_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadPoseVertices(Pose *pose)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_POSE_VERTEX)
        {
            Pose::Vertex v;
            v.index = Read<uint32_t>();
            ReadVector(v.offset);
            if (pose->hasNormals)
                ReadVector(v.normal);

            pose->vertices[v.index] = v;

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}